

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_deadline_timer.hpp
# Opt level: O2

size_t __thiscall
asio::basic_deadline_timer<boost::posix_time::ptime,_asio::time_traits<boost::posix_time::ptime>_>::
expires_at(basic_deadline_timer<boost::posix_time::ptime,_asio::time_traits<boost::posix_time::ptime>_>
           *this,time_type *expiry_time)

{
  size_t sVar1;
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>::expires_at
                    ((this->
                     super_basic_io_object<asio::detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>,_true>
                     ).service_,
                     &(this->
                      super_basic_io_object<asio::detail::deadline_timer_service<asio::time_traits<boost::posix_time::ptime>_>,_true>
                      ).implementation_,expiry_time,&local_28);
  detail::throw_error(&local_28,"expires_at");
  return sVar1;
}

Assistant:

std::size_t expires_at(const time_type& expiry_time)
  {
    asio::error_code ec;
    std::size_t s = this->get_service().expires_at(
        this->get_implementation(), expiry_time, ec);
    asio::detail::throw_error(ec, "expires_at");
    return s;
  }